

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

int __thiscall Fluid::init(Fluid *this,EVP_PKEY_CTX *ctx)

{
  Buffer *pBVar1;
  int extraout_EAX;
  VAO *pVVar2;
  Program *pPVar3;
  int i;
  int iVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_24;
  allocator<char> local_145;
  allocator<char> local_144;
  allocator<char> local_143;
  allocator<char> local_142;
  allocator<char> local_141;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_140;
  float local_13c;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [32];
  float local_60;
  float local_5c;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  circle;
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_38;
  
  init_ssbos(this);
  circle.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  circle.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  circle.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar4 = 0; iVar4 < this->num_circle_vertices; iVar4 = iVar4 + 1) {
    local_60 = ((float)iVar4 / (float)this->num_circle_vertices) * 3.1415927;
    local_60 = local_60 + local_60;
    local_5c = sinf(local_60);
    local_13c = cosf(local_60);
    local_140.x = local_5c;
    std::
    vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
    ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
              ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                *)&circle,(vec<2,_float,_(glm::qualifier)0> *)&local_140);
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)&local_38,&circle);
  gfx::Buffer::set_data<glm::vec<2,float,(glm::qualifier)0>>
            (&this->circle_verts,
             (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)&local_38,0x88e4);
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_38);
  pVVar2 = gfx::VAO::bind_attrib(&this->vao,&this->circle_verts,2,0x1406,0);
  pBVar1 = &this->particle_ssbo;
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0x10,0x30,3,0x1406,1);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0x20,0x30,3,0x1406,1);
  gfx::VAO::bind_attrib(pVVar2,pBVar1,0,0x30,4,0x1406,1);
  pBVar1 = &this->grid_ssbo;
  pVVar2 = gfx::VAO::bind_attrib(&this->grid_vao,pBVar1,0,0x50,3,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0x10,0x50,3,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0xc,0x50,1,0x1404,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0x1c,0x50,1,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0x2c,0x50,4,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0x40,0x50,1,0x1406,0);
  gfx::VAO::bind_attrib(pVVar2,pBVar1,0x44,0x50,1,0x1404,0);
  pBVar1 = &this->debug_lines_ssbo;
  pVVar2 = gfx::VAO::bind_attrib(&this->debug_lines_vao,pBVar1,0x10,0x30,3,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,pBVar1,0x20,0x30,3,0x1406,0);
  gfx::VAO::bind_attrib(pVVar2,pBVar1,0,0x30,4,0x1406,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"reset_grid.cs.glsl",(allocator<char> *)&local_c0);
  srcs._M_len = 2;
  srcs._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->reset_grid_program,srcs);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"atomic.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"common.glsl",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"p2g_common.glsl",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"p2g_accumulate.cs.glsl",&local_144);
  srcs_00._M_len = 4;
  srcs_00._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->p2g_accumulate_program,srcs_00);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"atomic.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"common.glsl",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"p2g_common.glsl",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"p2g_apply.cs.glsl",&local_144);
  srcs_01._M_len = 4;
  srcs_01._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->p2g_apply_program,srcs_01);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"grid_to_particle.cs.glsl",(allocator<char> *)&local_c0);
  srcs_02._M_len = 2;
  srcs_02._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->grid_to_particle_program,srcs_02);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"extrapolate.cs.glsl",(allocator<char> *)&local_c0);
  srcs_03._M_len = 2;
  srcs_03._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->extrapolate_program,srcs_03);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"set_vel_known.cs.glsl",(allocator<char> *)&local_c0);
  srcs_04._M_len = 2;
  srcs_04._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->set_vel_known_program,srcs_04);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"enforce_boundary.cs.glsl",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"body_forces.cs.glsl",&local_145);
  srcs_05._M_len = 3;
  srcs_05._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->body_forces_program,srcs_05);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"setup_project.cs.glsl",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"compute_divergence.cs.glsl",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"build_a.cs.glsl",&local_144);
  srcs_06._M_len = 4;
  srcs_06._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->setup_grid_project_program,srcs_06);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"jacobi_iterate.cs.glsl",(allocator<char> *)&local_c0);
  srcs_07._M_len = 2;
  srcs_07._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->jacobi_iterate_program,srcs_07);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"pressure_to_guess.cs.glsl",(allocator<char> *)&local_c0);
  srcs_08._M_len = 2;
  srcs_08._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->pressure_to_guess_program,srcs_08);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"pressure_update.cs.glsl",(allocator<char> *)&local_c0);
  srcs_09._M_len = 2;
  srcs_09._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->pressure_update_program,srcs_09);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"common.glsl",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"rand.glsl",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"particle_advect.cs.glsl",&local_145)
  ;
  srcs_10._M_len = 3;
  srcs_10._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::compute(&this->particle_advect_program,srcs_10);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"particles.vs.glsl",(allocator<char> *)&local_c0);
  srcs_11._M_len = 1;
  srcs_11._M_array = &local_a0;
  pPVar3 = gfx::Program::vertex(&this->program,srcs_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"lighting.glsl",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"particles.fs.glsl",&local_144);
  srcs_12._M_len = 2;
  srcs_12._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_12);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"common.glsl",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"grid.vs.glsl",&local_144);
  srcs_13._M_len = 2;
  srcs_13._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::vertex(&this->grid_program,srcs_13);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"common.glsl",&local_143);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"grid.gs.glsl",&local_141);
  srcs_14._M_len = 2;
  srcs_14._M_array = &local_a0;
  pPVar3 = gfx::Program::geometry(pPVar3,srcs_14);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"grid.fs.glsl",&local_142);
  srcs_15._M_len = 1;
  srcs_15._M_array = &local_c0;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_15);
  gfx::Program::compile(pPVar3);
  std::__cxx11::string::~string((string *)&local_c0);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_a0._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"debug_lines.vs.glsl",&local_145);
  srcs_16._M_len = 1;
  srcs_16._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::vertex(&this->debug_lines_program,srcs_16);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"debug_lines.gs.glsl",&local_144);
  srcs_17._M_len = 1;
  srcs_17._M_array = &local_a0;
  pPVar3 = gfx::Program::geometry(pPVar3,srcs_17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"debug_lines.fs.glsl",&local_143);
  srcs_18._M_len = 1;
  srcs_18._M_array = &local_c0;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_18);
  gfx::Program::compile(pPVar3);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"particles.vs.glsl",(allocator<char> *)&local_c0);
  srcs_19._M_len = 1;
  srcs_19._M_array = &local_a0;
  pPVar3 = gfx::Program::vertex(&this->ssf_spheres_program,srcs_19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"common.glsl",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"ssf_spheres.fs.glsl",&local_144);
  srcs_20._M_len = 2;
  srcs_20._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_20);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"screen_quad.vs.glsl",(allocator<char> *)&local_c0);
  srcs_21._M_len = 1;
  srcs_21._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::vertex(&this->ssf_smooth_program,srcs_21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"ssf_smooth.fs.glsl",&local_145);
  srcs_22._M_len = 1;
  srcs_22._M_array = &local_a0;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_22);
  gfx::Program::compile(pPVar3);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"screen_quad.vs.glsl",(allocator<char> *)&local_c0);
  srcs_23._M_len = 1;
  srcs_23._M_array = &local_a0;
  pPVar3 = gfx::Program::vertex(&this->ssf_shade_program,srcs_23);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"lighting.glsl",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"ssf_shade.fs.glsl",&local_144);
  srcs_24._M_len = 2;
  srcs_24._M_array = (iterator)&local_140;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_24);
  gfx::Program::compile(pPVar3);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::~string((string *)&local_a0);
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&circle.
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 );
  return extraout_EAX;
}

Assistant:

void init() {
        init_ssbos();

        // graphics initialization
        // circle vertices (for triangle fan)
        std::vector<glm::vec2> circle;
        for (int i = 0; i < num_circle_vertices; ++i) {
            const float f = static_cast<float>(i) / num_circle_vertices * glm::pi<float>() * 2.0;
            circle.emplace_back(glm::vec2(glm::sin(f), glm::cos(f)));
        }
        circle_verts.set_data(circle);

        vao.bind_attrib(circle_verts, 2, GL_FLOAT)
           .bind_attrib(particle_ssbo, offsetof(Particle, pos), sizeof(Particle), 3, GL_FLOAT, gfx::INSTANCED)
           .bind_attrib(particle_ssbo, offsetof(Particle, vel), sizeof(Particle), 3, GL_FLOAT, gfx::INSTANCED)
           .bind_attrib(particle_ssbo, offsetof(Particle, color), sizeof(Particle), 4, GL_FLOAT, gfx::INSTANCED);
        
        grid_vao.bind_attrib(grid_ssbo, offsetof(GridCell, pos), sizeof(GridCell), 3, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, vel), sizeof(GridCell), 3, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, type), sizeof(GridCell), 1, GL_INT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, rhs), sizeof(GridCell), 1, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, a_diag), sizeof(GridCell), 4, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, pressure), sizeof(GridCell), 1, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, vel_unknown), sizeof(GridCell), 1, GL_INT, gfx::NOT_INSTANCED);

        debug_lines_vao.bind_attrib(debug_lines_ssbo, offsetof(DebugLine, a), sizeof(DebugLine), 3, GL_FLOAT, gfx::NOT_INSTANCED)
            .bind_attrib(debug_lines_ssbo, offsetof(DebugLine, b), sizeof(DebugLine), 3, GL_FLOAT, gfx::NOT_INSTANCED)
            .bind_attrib(debug_lines_ssbo, offsetof(DebugLine, color), sizeof(DebugLine), 4, GL_FLOAT, gfx::NOT_INSTANCED);
        
        
        reset_grid_program.compute({"common.glsl", "reset_grid.cs.glsl"}).compile();
        p2g_accumulate_program.compute({"atomic.glsl", "common.glsl", "p2g_common.glsl", "p2g_accumulate.cs.glsl"}).compile();
        p2g_apply_program.compute({"atomic.glsl", "common.glsl", "p2g_common.glsl", "p2g_apply.cs.glsl"}).compile();
        grid_to_particle_program.compute({"common.glsl", "grid_to_particle.cs.glsl"}).compile();
        extrapolate_program.compute({"common.glsl", "extrapolate.cs.glsl"}).compile();
        set_vel_known_program.compute({"common.glsl", "set_vel_known.cs.glsl"}).compile();
        body_forces_program.compute({"common.glsl", "enforce_boundary.cs.glsl", "body_forces.cs.glsl"}).compile();
        setup_grid_project_program.compute({"common.glsl", "setup_project.cs.glsl", "compute_divergence.cs.glsl", "build_a.cs.glsl"}).compile();
        jacobi_iterate_program.compute({"common.glsl", "jacobi_iterate.cs.glsl"}).compile();
        pressure_to_guess_program.compute({"common.glsl", "pressure_to_guess.cs.glsl"}).compile();
        pressure_update_program.compute({"common.glsl", "pressure_update.cs.glsl"}).compile();
        particle_advect_program.compute({"common.glsl", "rand.glsl", "particle_advect.cs.glsl"}).compile();
        
        program.vertex({"particles.vs.glsl"}).fragment({"lighting.glsl", "particles.fs.glsl"}).compile();
        grid_program.vertex({"common.glsl", "grid.vs.glsl"}).geometry({"common.glsl", "grid.gs.glsl"}).fragment({"grid.fs.glsl"}).compile();
        debug_lines_program.vertex({"debug_lines.vs.glsl"}).geometry({"debug_lines.gs.glsl"}).fragment({"debug_lines.fs.glsl"}).compile();

        ssf_spheres_program.vertex({"particles.vs.glsl"}).fragment({"common.glsl", "ssf_spheres.fs.glsl"}).compile();
        ssf_smooth_program.vertex({"screen_quad.vs.glsl"}).fragment({"ssf_smooth.fs.glsl"}).compile();
        ssf_shade_program.vertex({"screen_quad.vs.glsl"}).fragment({"lighting.glsl", "ssf_shade.fs.glsl"}).compile();
    }